

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O3

bool __thiscall QPDFFormFieldObjectHelper::isChecked(QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  int iVar2;
  undefined1 local_50 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  bVar1 = isCheckbox(this);
  if (bVar1) {
    getValue((QPDFFormFieldObjectHelper *)(local_50 + 0x10));
    bVar1 = QPDFObjectHandle::isName((QPDFObjectHandle *)(local_50 + 0x10));
    if (bVar1) {
      getValue((QPDFFormFieldObjectHelper *)local_50);
      QPDFObjectHandle::getName_abi_cxx11_((string *)(local_50 + 0x20),(QPDFObjectHandle *)local_50)
      ;
      iVar2 = std::__cxx11::string::compare(local_50 + 0x20);
      bVar1 = iVar2 != 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._32_8_ != &local_20) {
        operator_delete((void *)local_50._32_8_,(ulong)(local_20._M_allocated_capacity + 1));
      }
      if ((element_type *)local_50._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
      }
    }
    else {
      bVar1 = false;
    }
    if ((element_type *)local_50._24_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._24_8_);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
QPDFFormFieldObjectHelper::isChecked()
{
    return isCheckbox() && getValue().isName() && (getValue().getName() != "/Off");
}